

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

string * __thiscall test_leaky_relu::vars_abi_cxx11_(test_leaky_relu *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  float *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_140 [12];
  ggml_type in_stack_fffffffffffffecc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_120 [8];
  array<long,_4UL> *in_stack_fffffffffffffee8;
  string local_100 [32];
  string local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  var_to_str_abi_cxx11_(in_stack_fffffffffffffecc);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long,4ul>(in_stack_fffffffffffffee8);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<float>(in_stack_fffffffffffffe98);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  return __lhs;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR3(type, ne_a, negative_slope);
    }